

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

void * stbi__bmp_parse_header(stbi__context *s,stbi__bmp_data *info)

{
  stbi_uc sVar1;
  stbi__uint32 sVar2;
  stbi__uint32 sVar3;
  int iVar4;
  stbi__uint32 sVar5;
  stbi__bmp_data *in_RSI;
  stbi__uint32 *in_RDI;
  int i;
  int compress;
  int hsz;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  void *local_8;
  
  sVar1 = stbi__get8((stbi__context *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8))
  ;
  if ((sVar1 == 'B') &&
     (sVar1 = stbi__get8((stbi__context *)
                         CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8)),
     sVar1 == 'M')) {
    stbi__get32le((stbi__context *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    stbi__get16le((stbi__context *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    stbi__get16le((stbi__context *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    sVar2 = stbi__get32le((stbi__context *)
                          CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    in_RSI->offset = sVar2;
    sVar2 = stbi__get32le((stbi__context *)
                          CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    in_RSI->hsz = sVar2;
    in_RSI->ma = 0;
    in_RSI->mb = 0;
    in_RSI->mg = 0;
    in_RSI->mr = 0;
    in_RSI->extra_read = 0xe;
    if (in_RSI->offset < 0) {
      stbi__err((char *)CONCAT44(sVar2,in_stack_ffffffffffffffe0));
      local_8 = (void *)0x0;
    }
    else if ((((sVar2 == 0xc) || (sVar2 == 0x28)) || (sVar2 == 0x38)) ||
            ((sVar2 == 0x6c || (sVar2 == 0x7c)))) {
      if (sVar2 == 0xc) {
        sVar3 = stbi__get16le((stbi__context *)CONCAT44(0xc,in_stack_ffffffffffffffe0));
        *in_RDI = sVar3;
        sVar3 = stbi__get16le((stbi__context *)CONCAT44(sVar2,in_stack_ffffffffffffffe0));
        in_RDI[1] = sVar3;
      }
      else {
        sVar3 = stbi__get32le((stbi__context *)CONCAT44(sVar2,in_stack_ffffffffffffffe0));
        *in_RDI = sVar3;
        sVar3 = stbi__get32le((stbi__context *)CONCAT44(sVar2,in_stack_ffffffffffffffe0));
        in_RDI[1] = sVar3;
      }
      iVar4 = stbi__get16le((stbi__context *)CONCAT44(sVar2,in_stack_ffffffffffffffe0));
      if (iVar4 == 1) {
        iVar4 = stbi__get16le((stbi__context *)CONCAT44(sVar2,in_stack_ffffffffffffffe0));
        in_RSI->bpp = iVar4;
        if (sVar2 != 0xc) {
          sVar3 = stbi__get32le((stbi__context *)CONCAT44(sVar2,in_stack_ffffffffffffffe0));
          if ((sVar3 == 1) || (sVar3 == 2)) {
            stbi__err((char *)CONCAT44(sVar2,sVar3));
            return (void *)0x0;
          }
          if (3 < (int)sVar3) {
            stbi__err((char *)CONCAT44(sVar2,sVar3));
            return (void *)0x0;
          }
          if (((sVar3 == 3) && (in_RSI->bpp != 0x10)) && (in_RSI->bpp != 0x20)) {
            stbi__err((char *)CONCAT44(sVar2,3));
            return (void *)0x0;
          }
          stbi__get32le((stbi__context *)CONCAT44(sVar2,sVar3));
          stbi__get32le((stbi__context *)CONCAT44(sVar2,sVar3));
          stbi__get32le((stbi__context *)CONCAT44(sVar2,sVar3));
          stbi__get32le((stbi__context *)CONCAT44(sVar2,sVar3));
          stbi__get32le((stbi__context *)CONCAT44(sVar2,sVar3));
          if ((sVar2 == 0x28) || (sVar2 == 0x38)) {
            if (sVar2 == 0x38) {
              stbi__get32le((stbi__context *)CONCAT44(0x38,sVar3));
              stbi__get32le((stbi__context *)CONCAT44(sVar2,sVar3));
              stbi__get32le((stbi__context *)CONCAT44(sVar2,sVar3));
              stbi__get32le((stbi__context *)CONCAT44(sVar2,sVar3));
            }
            if ((in_RSI->bpp == 0x10) || (in_RSI->bpp == 0x20)) {
              if (sVar3 == 0) {
                stbi__bmp_set_mask_defaults(in_RSI,0);
              }
              else {
                if (sVar3 != 3) {
                  stbi__err((char *)CONCAT44(sVar2,sVar3));
                  return (void *)0x0;
                }
                sVar5 = stbi__get32le((stbi__context *)CONCAT44(sVar2,3));
                in_RSI->mr = sVar5;
                sVar5 = stbi__get32le((stbi__context *)CONCAT44(sVar2,sVar3));
                in_RSI->mg = sVar5;
                sVar5 = stbi__get32le((stbi__context *)CONCAT44(sVar2,sVar3));
                in_RSI->mb = sVar5;
                in_RSI->extra_read = in_RSI->extra_read + 0xc;
                if ((in_RSI->mr == in_RSI->mg) && (in_RSI->mg == in_RSI->mb)) {
                  stbi__err((char *)CONCAT44(sVar2,sVar3));
                  return (void *)0x0;
                }
              }
            }
          }
          else {
            if ((sVar2 != 0x6c) && (sVar2 != 0x7c)) {
              stbi__err((char *)CONCAT44(sVar2,sVar3));
              return (void *)0x0;
            }
            sVar5 = stbi__get32le((stbi__context *)CONCAT44(sVar2,sVar3));
            in_RSI->mr = sVar5;
            sVar5 = stbi__get32le((stbi__context *)CONCAT44(sVar2,sVar3));
            in_RSI->mg = sVar5;
            sVar5 = stbi__get32le((stbi__context *)CONCAT44(sVar2,sVar3));
            in_RSI->mb = sVar5;
            sVar5 = stbi__get32le((stbi__context *)CONCAT44(sVar2,sVar3));
            in_RSI->ma = sVar5;
            if (sVar3 != 3) {
              stbi__bmp_set_mask_defaults(in_RSI,sVar3);
            }
            stbi__get32le((stbi__context *)CONCAT44(sVar2,sVar3));
            for (iVar4 = 0; iVar4 < 0xc; iVar4 = iVar4 + 1) {
              stbi__get32le((stbi__context *)CONCAT44(sVar2,sVar3));
            }
            if (sVar2 == 0x7c) {
              stbi__get32le((stbi__context *)CONCAT44(0x7c,sVar3));
              stbi__get32le((stbi__context *)CONCAT44(sVar2,sVar3));
              stbi__get32le((stbi__context *)CONCAT44(sVar2,sVar3));
              stbi__get32le((stbi__context *)CONCAT44(sVar2,sVar3));
            }
          }
        }
        local_8 = (void *)0x1;
      }
      else {
        stbi__err((char *)CONCAT44(sVar2,in_stack_ffffffffffffffe0));
        local_8 = (void *)0x0;
      }
    }
    else {
      stbi__err((char *)CONCAT44(sVar2,in_stack_ffffffffffffffe0));
      local_8 = (void *)0x0;
    }
  }
  else {
    stbi__err((char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    local_8 = (void *)0x0;
  }
  return local_8;
}

Assistant:

static void *stbi__bmp_parse_header(stbi__context *s, stbi__bmp_data *info)
{
   int hsz;
   if (stbi__get8(s) != 'B' || stbi__get8(s) != 'M') return stbi__errpuc("not BMP", "Corrupt BMP");
   stbi__get32le(s); // discard filesize
   stbi__get16le(s); // discard reserved
   stbi__get16le(s); // discard reserved
   info->offset = stbi__get32le(s);
   info->hsz = hsz = stbi__get32le(s);
   info->mr = info->mg = info->mb = info->ma = 0;
   info->extra_read = 14;

   if (info->offset < 0) return stbi__errpuc("bad BMP", "bad BMP");

   if (hsz != 12 && hsz != 40 && hsz != 56 && hsz != 108 && hsz != 124) return stbi__errpuc("unknown BMP", "BMP type not supported: unknown");
   if (hsz == 12) {
      s->img_x = stbi__get16le(s);
      s->img_y = stbi__get16le(s);
   } else {
      s->img_x = stbi__get32le(s);
      s->img_y = stbi__get32le(s);
   }
   if (stbi__get16le(s) != 1) return stbi__errpuc("bad BMP", "bad BMP");
   info->bpp = stbi__get16le(s);
   if (hsz != 12) {
      int compress = stbi__get32le(s);
      if (compress == 1 || compress == 2) return stbi__errpuc("BMP RLE", "BMP type not supported: RLE");
      if (compress >= 4) return stbi__errpuc("BMP JPEG/PNG", "BMP type not supported: unsupported compression"); // this includes PNG/JPEG modes
      if (compress == 3 && info->bpp != 16 && info->bpp != 32) return stbi__errpuc("bad BMP", "bad BMP"); // bitfields requires 16 or 32 bits/pixel
      stbi__get32le(s); // discard sizeof
      stbi__get32le(s); // discard hres
      stbi__get32le(s); // discard vres
      stbi__get32le(s); // discard colorsused
      stbi__get32le(s); // discard max important
      if (hsz == 40 || hsz == 56) {
         if (hsz == 56) {
            stbi__get32le(s);
            stbi__get32le(s);
            stbi__get32le(s);
            stbi__get32le(s);
         }
         if (info->bpp == 16 || info->bpp == 32) {
            if (compress == 0) {
               stbi__bmp_set_mask_defaults(info, compress);
            } else if (compress == 3) {
               info->mr = stbi__get32le(s);
               info->mg = stbi__get32le(s);
               info->mb = stbi__get32le(s);
               info->extra_read += 12;
               // not documented, but generated by photoshop and handled by mspaint
               if (info->mr == info->mg && info->mg == info->mb) {
                  // ?!?!?
                  return stbi__errpuc("bad BMP", "bad BMP");
               }
            } else
               return stbi__errpuc("bad BMP", "bad BMP");
         }
      } else {
         // V4/V5 header
         int i;
         if (hsz != 108 && hsz != 124)
            return stbi__errpuc("bad BMP", "bad BMP");
         info->mr = stbi__get32le(s);
         info->mg = stbi__get32le(s);
         info->mb = stbi__get32le(s);
         info->ma = stbi__get32le(s);
         if (compress != 3) // override mr/mg/mb unless in BI_BITFIELDS mode, as per docs
            stbi__bmp_set_mask_defaults(info, compress);
         stbi__get32le(s); // discard color space
         for (i=0; i < 12; ++i)
            stbi__get32le(s); // discard color space parameters
         if (hsz == 124) {
            stbi__get32le(s); // discard rendering intent
            stbi__get32le(s); // discard offset of profile data
            stbi__get32le(s); // discard size of profile data
            stbi__get32le(s); // discard reserved
         }
      }
   }
   return (void *) 1;
}